

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

void Au_ManReorderModels_rec(Au_Ntk_t *pNtk,Vec_Int_t *vOrder)

{
  Au_Obj_t *p;
  Au_Ntk_t *pNtk_00;
  int i;
  
  if (pNtk->fMark != 0) {
    return;
  }
  pNtk->fMark = 1;
  for (i = 0; i < (pNtk->vObjs).nSize; i = i + 1) {
    p = Au_NtkObjI(pNtk,i);
    if (((undefined1  [16])*p & (undefined1  [16])0x700000000) == (undefined1  [16])0x600000000) {
      pNtk_00 = Au_ObjModel(p);
      if (pNtk_00 != pNtk && pNtk_00 != (Au_Ntk_t *)0x0) {
        Au_ManReorderModels_rec(pNtk_00,vOrder);
      }
    }
  }
  Vec_IntPush(vOrder,pNtk->Id);
  return;
}

Assistant:

void Au_ManReorderModels_rec( Au_Ntk_t * pNtk, Vec_Int_t * vOrder )
{
    Au_Ntk_t * pBoxModel;
    Au_Obj_t * pObj;
    int k;
    if ( pNtk->fMark )
        return;
    pNtk->fMark = 1;
    Au_NtkForEachBox( pNtk, pObj, k )
    {
        pBoxModel = Au_ObjModel(pObj);
        if ( pBoxModel == NULL || pBoxModel == pNtk )
            continue;
        Au_ManReorderModels_rec( pBoxModel, vOrder );
    }
    Vec_IntPush( vOrder, pNtk->Id );
}